

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O2

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingStatementInternal
          (ClientContext *this,ClientContextLock *lock,string *query,
          unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
          *statement,PendingQueryParameters *parameters)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
  *puVar1;
  pointer pSVar2;
  PreparedStatementData *pPVar3;
  type statement_00;
  string *extraout_RDX;
  shared_ptr<duckdb::PreparedStatementData,_true> *statement_p;
  ErrorData *this_00;
  optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
  *in_R9;
  bool bVar4;
  shared_ptr<duckdb::PreparedStatementData,_true> prepared;
  string error_message;
  allocator local_1b9;
  undefined1 local_1b8 [24];
  InvalidInputException local_1a0;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_190;
  string local_188;
  undefined1 local_168 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_160 [2];
  string local_150;
  ErrorData local_130;
  ErrorData local_b0;
  
  if (in_R9->ptr !=
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
       *)0x0) {
    puVar1 = optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
             ::operator*(in_R9);
    pSVar2 = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
             operator->((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                         *)parameters);
    PreparedStatement::VerifyParameters<duckdb::BoundParameterData>(puVar1,&pSVar2->named_param_map)
    ;
    query = extraout_RDX;
  }
  local_190._M_head_impl = (RegisteredStateManager *)(parameters->parameters).ptr;
  (parameters->parameters).ptr =
       (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
        *)0x0;
  CreatePreparedStatement
            ((ClientContext *)local_1b8,lock,query,statement,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
              *)&local_190,(PreparedStatementMode)in_R9->ptr);
  if ((tuple<duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
      )local_190._M_head_impl != (_Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>)0x0) {
    (*(code *)((_Hashtable *)&(local_190._M_head_impl)->lock)->_M_buckets[1])();
  }
  local_190._M_head_impl = (RegisteredStateManager *)0x0;
  if (in_R9->ptr ==
      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>
       *)0x0) {
    bVar4 = true;
  }
  else {
    puVar1 = optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
             ::operator->(in_R9);
    bVar4 = (puVar1->_M_h)._M_element_count == 0;
  }
  pPVar3 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                     ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_1b8);
  if ((bool)(bVar4 ^ 1U | (pPVar3->properties).parameter_count == 0)) {
    pPVar3 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_1b8);
    if ((pPVar3->properties).bound_all_parameters != false) {
      statement_00 = shared_ptr<duckdb::PreparedStatementData,_true>::operator*
                               ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_1b8);
      CheckIfPreparedStatementIsExecutable((ClientContext *)lock,statement_00);
      local_168 = (undefined1  [8])local_1b8._0_8_;
      a_Stack_160[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      local_1b8._0_8_ = (element_type *)0x0;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      PendingPreparedStatementInternal(this,lock,statement_p,(PendingQueryParameters *)local_168);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_160);
      goto LAB_019be144;
    }
    ::std::__cxx11::string::string((string *)&local_188,"Not all parameters were bound",&local_1b9);
    InvalidInputException::InvalidInputException(&local_1a0,(string *)&local_188);
    ErrorData::ErrorData(&local_130,(exception *)&local_1a0);
    ErrorResult<duckdb::PendingQueryResult>(this,(ErrorData *)lock,(string *)&local_130);
    this_00 = &local_130;
  }
  else {
    ::std::__cxx11::string::string
              ((string *)&local_150,"Expected %lld parameters, but none were supplied",
               (allocator *)&local_1a0);
    pPVar3 = shared_ptr<duckdb::PreparedStatementData,_true>::operator->
                       ((shared_ptr<duckdb::PreparedStatementData,_true> *)local_1b8);
    Exception::ConstructMessage<unsigned_long>
              (&local_188,&local_150,(pPVar3->properties).parameter_count);
    ::std::__cxx11::string::~string((string *)&local_150);
    InvalidInputException::InvalidInputException(&local_1a0,(string *)&local_188);
    ErrorData::ErrorData(&local_b0,(exception *)&local_1a0);
    ErrorResult<duckdb::PendingQueryResult>(this,(ErrorData *)lock,(string *)&local_b0);
    this_00 = &local_b0;
  }
  ErrorData::~ErrorData(this_00);
  ::std::runtime_error::~runtime_error((runtime_error *)&local_1a0);
  ::std::__cxx11::string::~string((string *)&local_188);
LAB_019be144:
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8));
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingStatementInternal(ClientContextLock &lock, const string &query,
                                                                       unique_ptr<SQLStatement> statement,
                                                                       const PendingQueryParameters &parameters) {
	// prepare the query for execution
	if (parameters.parameters) {
		PreparedStatement::VerifyParameters(*parameters.parameters, statement->named_param_map);
	}

	auto prepared = CreatePreparedStatement(lock, query, std::move(statement), parameters.parameters,
	                                        PreparedStatementMode::PREPARE_AND_EXECUTE);

	idx_t parameter_count = !parameters.parameters ? 0 : parameters.parameters->size();
	if (prepared->properties.parameter_count > 0 && parameter_count == 0) {
		string error_message = StringUtil::Format("Expected %lld parameters, but none were supplied",
		                                          prepared->properties.parameter_count);
		return ErrorResult<PendingQueryResult>(InvalidInputException(error_message), query);
	}
	if (!prepared->properties.bound_all_parameters) {
		return ErrorResult<PendingQueryResult>(InvalidInputException("Not all parameters were bound"), query);
	}
	// execute the prepared statement
	CheckIfPreparedStatementIsExecutable(*prepared);
	return PendingPreparedStatementInternal(lock, std::move(prepared), parameters);
}